

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::Render(Element *this)

{
  pointer ppEVar1;
  bool bVar2;
  pointer ppEVar3;
  
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if (this->stacking_context_dirty == true) {
    BuildLocalStackingContext(this);
  }
  UpdateTransformState(this);
  ElementUtilities::ApplyTransform(this);
  ElementEffects::RenderEffects(&this->meta->effects,Enter);
  bVar2 = ElementUtilities::SetClippingRegion(this,false);
  if (bVar2) {
    ElementBackgroundBorder::Render(&this->meta->background_border,this);
    ElementEffects::RenderEffects(&this->meta->effects,Decoration);
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xb])(this);
  }
  ppEVar1 = (this->stacking_context).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar3 = (this->stacking_context).
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppEVar3 != ppEVar1; ppEVar3 = ppEVar3 + 1) {
    Render(*ppEVar3);
  }
  ElementEffects::RenderEffects(&this->meta->effects,Exit);
  return;
}

Assistant:

void Element::Render()
{
#ifdef RMLUI_TRACY_PROFILING
	auto name = GetAddress(false, false);
	RMLUI_ZoneScoped;
	RMLUI_ZoneText(name.c_str(), name.size());
#endif

	UpdateAbsoluteOffsetAndRenderBoxData();

	// Rebuild our stacking context if necessary.
	if (stacking_context_dirty)
		BuildLocalStackingContext();

	UpdateTransformState();

	// Apply our transform
	ElementUtilities::ApplyTransform(*this);

	meta->effects.RenderEffects(RenderStage::Enter);

	// Set up the clipping region for this element.
	if (ElementUtilities::SetClippingRegion(this))
	{
		meta->background_border.Render(this);
		meta->effects.RenderEffects(RenderStage::Decoration);

		{
			RMLUI_ZoneScopedNC("OnRender", 0x228B22);

			OnRender();
		}
	}

	// Render all elements in our local stacking context.
	for (Element* element : stacking_context)
		element->Render();

	meta->effects.RenderEffects(RenderStage::Exit);
}